

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

bool duckdb_snappy::RawUncompress(Source *compressed,char *uncompressed)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  SnappyArrayWriter output;
  SnappyDecompressor decompressor;
  uint32_t local_5c;
  SnappyArrayWriter local_58;
  SnappyDecompressor local_38;
  
  local_38.peeked_ = 0;
  local_38.eof_ = false;
  local_38.ip_ = (char *)0x0;
  local_38.ip_limit_ = (char *)0x0;
  local_5c = 0;
  local_58.base_ = uncompressed;
  local_58.op_ = uncompressed;
  local_58.op_limit_ = uncompressed;
  local_58.op_limit_min_slop_ = uncompressed;
  local_38.reader_ = compressed;
  bVar1 = SnappyDecompressor::ReadUncompressedLength(&local_38,&local_5c);
  if (bVar1) {
    (*compressed->_vptr_Source[2])(compressed);
    uVar2 = (ulong)local_5c;
    local_58.op_limit_ = local_58.op_ + uVar2;
    uVar3 = 0x3f;
    if (uVar2 < 0x3f) {
      uVar3 = uVar2;
    }
    local_58.op_limit_min_slop_ = local_58.op_limit_ + -uVar3;
    SnappyDecompressor::DecompressAllTags<duckdb_snappy::SnappyArrayWriter>(&local_38,&local_58);
    if (local_38.eof_ == true) {
      bVar1 = local_58.op_ == local_58.op_limit_;
      goto LAB_01d2b3d3;
    }
  }
  bVar1 = false;
LAB_01d2b3d3:
  (*(local_38.reader_)->_vptr_Source[4])(local_38.reader_,(ulong)local_38.peeked_);
  return bVar1;
}

Assistant:

bool RawUncompress(Source* compressed, char* uncompressed) {
  SnappyArrayWriter output(uncompressed);
  return InternalUncompress(compressed, &output);
}